

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  if (((pA != (ExprList *)0x0 || pB != (ExprList *)0x0) &&
      (iVar3 = 1, pA != (ExprList *)0x0 && pB != (ExprList *)0x0)) && (pA->nExpr == pB->nExpr)) {
    lVar4 = -1;
    lVar2 = 0x20;
    do {
      lVar4 = lVar4 + 1;
      if (pA->nExpr <= lVar4) {
        return 0;
      }
      if (*(char *)((long)pA->a + lVar2 + -8) != *(char *)((long)pB->a + lVar2 + -8)) {
        return 1;
      }
      iVar1 = sqlite3ExprCompare((Parse *)0x0,*(Expr **)((long)(pA->a + -1) + lVar2),
                                 *(Expr **)((long)(pB->a + -1) + lVar2),iTab);
      lVar2 = lVar2 + 0x20;
    } while (iVar1 == 0);
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(ExprList *pA, ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].sortOrder!=pB->a[i].sortOrder ) return 1;
    if( sqlite3ExprCompare(0, pExprA, pExprB, iTab) ) return 1;
  }
  return 0;
}